

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O0

int __thiscall anon_unknown.dwarf_f6f6::AudioState::getSync(AudioState *this)

{
  bool bVar1;
  rep rVar2;
  duration<double,_std::ratio<1L,_1L>_> *in_RDI;
  duration<double,_std::ratio<1L,_1L>_> dVar3;
  duration<double,_std::ratio<1L,_1L>_> avg_diff;
  type diff;
  nanoseconds ref_clock;
  AudioState *in_stack_000000e8;
  MovieState *in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 uVar4;
  undefined1 uVar5;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff70;
  duration<long,_std::ratio<1L,_1L>_> in_stack_ffffffffffffff78;
  rep_conflict local_40;
  int local_4;
  
  if (*(int *)((long)in_RDI->__r + 0x10) == 0) {
    local_4 = 0;
  }
  else {
    MovieState::getMasterClock(in_stack_ffffffffffffff58);
    getClockNoLock(in_stack_000000e8);
    std::chrono::operator-
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff78.__r,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff70);
    bVar1 = std::chrono::operator<
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff70,
                       (duration<long,_std::ratio<1L,_1L>_> *)in_RDI);
    uVar5 = false;
    if (bVar1) {
      std::chrono::duration<long,_std::ratio<1L,_1L>_>::operator-
                ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff58);
      uVar5 = std::chrono::operator>
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                         CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60
                                                )),
                         (duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff58);
    }
    if (((uVar5 ^ 0xff) & 1) == 0) {
      std::chrono::operator*
                (in_RDI,(double *)
                        CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)
                                ));
      std::chrono::operator+
                ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff78.__r,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff70);
      std::chrono::duration<double,std::ratio<1l,1l>>::
      duration<double,std::ratio<1l,1000000000l>,void>
                (in_stack_ffffffffffffff70,(duration<double,_std::ratio<1L,_1000000000L>_> *)in_RDI)
      ;
      in_RDI[0x1a].__r = local_40;
      std::chrono::operator*
                (in_RDI,(double *)
                        CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)
                                ));
      std::chrono::operator/
                (in_RDI,(double *)
                        CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)
                                ));
      bVar1 = std::chrono::operator<(in_stack_ffffffffffffff70,in_RDI);
      uVar4 = false;
      if (bVar1) {
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::operator-
                  ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff58);
        uVar4 = std::chrono::operator>
                          ((duration<double,_std::ratio<1L,_1L>_> *)
                           CONCAT17(uVar5,CONCAT16(uVar4,in_stack_ffffffffffffff60)),
                           (duration<double,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff58);
      }
      if ((bool)uVar4 == false) {
        std::chrono::duration<long,std::ratio<1l,1000000000l>>::
        duration<long,std::ratio<1l,1000l>,void>
                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff70,
                   (duration<long,_std::ratio<1L,_1000L>_> *)in_RDI);
        std::min<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff58,
                   (duration<long,_std::ratio<1L,_1000000000L>_> *)0x115fa0);
        std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator->
                  ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)0x115fb9)
        ;
        std::chrono::operator*
                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_RDI,
                   (int *)CONCAT17(uVar5,CONCAT16(uVar4,in_stack_ffffffffffffff60)));
        std::chrono::
        duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff58);
        rVar2 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                          ((duration<long,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffff78);
        local_4 = (int)rVar2;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      dVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
      in_RDI[0x1a].__r = dVar3.__r;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int AudioState::getSync()
{
    if(mMovie.mAVSyncType == SyncMaster::Audio)
        return 0;

    auto ref_clock = mMovie.getMasterClock();
    auto diff = ref_clock - getClockNoLock();

    if(!(diff < AVNoSyncThreshold && diff > -AVNoSyncThreshold))
    {
        /* Difference is TOO big; reset accumulated average */
        mClockDiffAvg = seconds_d64::zero();
        return 0;
    }

    /* Accumulate the diffs */
    mClockDiffAvg = mClockDiffAvg*AudioAvgFilterCoeff + diff;
    auto avg_diff = mClockDiffAvg*(1.0 - AudioAvgFilterCoeff);
    if(avg_diff < AudioSyncThreshold/2.0 && avg_diff > -AudioSyncThreshold)
        return 0;

    /* Constrain the per-update difference to avoid exceedingly large skips */
    diff = std::min<nanoseconds>(diff, AudioSampleCorrectionMax);
    return static_cast<int>(duration_cast<seconds>(diff*mCodecCtx->sample_rate).count());
}